

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlValidNormalizeString(xmlChar *str)

{
  xmlChar *local_20;
  xmlChar *src;
  xmlChar *dst;
  xmlChar *str_local;
  
  local_20 = str;
  if (str != (xmlChar *)0x0) {
    for (; src = str, *local_20 == ' '; local_20 = local_20 + 1) {
    }
    while (*local_20 != '\0') {
      if (*local_20 == ' ') {
        for (; *local_20 == ' '; local_20 = local_20 + 1) {
        }
        if (*local_20 != '\0') {
          *src = ' ';
          src = src + 1;
        }
      }
      else {
        *src = *local_20;
        local_20 = local_20 + 1;
        src = src + 1;
      }
    }
    *src = '\0';
  }
  return;
}

Assistant:

static void
xmlValidNormalizeString(xmlChar *str) {
    xmlChar *dst;
    const xmlChar *src;

    if (str == NULL)
        return;
    src = str;
    dst = str;

    while (*src == 0x20) src++;
    while (*src != 0) {
	if (*src == 0x20) {
	    while (*src == 0x20) src++;
	    if (*src != 0)
		*dst++ = 0x20;
	} else {
	    *dst++ = *src++;
	}
    }
    *dst = 0;
}